

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.h
# Opt level: O2

double __thiscall
imrt::Plan::get_delta_eval(Plan *this,Station *s,int i,int j,double intensity,int n_voxels)

{
  int angle;
  EvaluationFunction *this_00;
  mapped_type *pmVar1;
  double dVar2;
  key_type local_28;
  
  this_00 = this->ev;
  angle = s->angle;
  local_28.second = j;
  local_28.first = i;
  pmVar1 = std::
           map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
           ::at(&s->pos2beam,&local_28);
  dVar2 = EvaluationFunction::get_delta_eval
                    (this_00,angle,*pmVar1,intensity,&this->w,&this->Zmin,&this->Zmax,n_voxels);
  return dVar2;
}

Assistant:

double get_delta_eval (Station& s, int i, int j, double intensity, int n_voxels=999999){
    return ev.get_delta_eval(s.getAngle(),
    s.pos2beam.at(make_pair(i,j)), intensity, w, Zmin, Zmax, n_voxels);
  }